

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

ConfigIter Clasp::Cli::ClaspCliConfig::getConfig(ConfigKey k)

{
  ulong in_RAX;
  
  if ((k < config_max_value) &&
     (in_RAX = 0, (0xbff7fU >> (k & (config_nolearn|config_s13)) & 1) != 0)) {
    return (ConfigIter)(&DAT_00199058 + *(int *)(&DAT_00199058 + (ulong)k * 4));
  }
  Potassco::fail(-2,"static ConfigIter Clasp::Cli::ClaspCliConfig::getConfig(ConfigKey)",0x2d5,
                 "k == config_default","Invalid config key \'%d\'",(ulong)k,
                 in_RAX & 0xffffffff00000000);
}

Assistant:

ConfigIter ClaspCliConfig::getConfig(ConfigKey k) {
	#define MAKE_CONFIG(n, o1, o2) "/[" n "]\0/\0/" o1 " " o2 "\0"
	switch(k) {
		#define CONFIG(id, n,c,s,p) case config_##n: return ConfigIter(MAKE_CONFIG(#n, s, c));
		#define CLASP_CLI_DEFAULT_CONFIGS
		#define CLASP_CLI_AUX_CONFIGS
		#include <clasp/cli/clasp_cli_configs.inl>
		case config_many:
		#define CONFIG(id,n,c,s,p) MAKE_CONFIG("solver." POTASSCO_STRING(id), c, p)
		#define CLASP_CLI_DEFAULT_CONFIGS
		#define CLASP_CLI_AUX_CONFIGS
			return ConfigIter(
				#include <clasp/cli/clasp_cli_configs.inl>
			);
		default: POTASSCO_REQUIRE(k == config_default, "Invalid config key '%d'", (int)k); return ConfigIter("/default\0/\0/\0");
	}
	#undef MAKE_CONFIG
}